

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

bool __thiscall QMakeEvaluator::loadSpecInternal(QMakeEvaluator *this)

{
  storage_type_conflict *psVar1;
  QString *pQVar2;
  Data *pDVar3;
  VisitReturn VVar4;
  QArrayDataPointer<ProString> *this_00;
  storage_type *psVar5;
  ProString *this_01;
  long in_FS_OFFSET;
  bool bVar6;
  QByteArrayView QVar7;
  QLatin1StringView local_f8;
  QStringView local_e8;
  ProString local_b8;
  QArrayDataPointer<ProString> local_80;
  QArrayDataPointer<char16_t> local_68;
  QLatin1StringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLatin1String::QLatin1String(&local_48,"spec_pre.prf");
  QString::QString(&local_b8.m_string,local_48);
  bVar6 = false;
  VVar4 = evaluateFeatureFile(this,&local_b8.m_string,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  if (VVar4 == ReturnTrue) {
    local_68.size = -0x5555555555555556;
    local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_68.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar2 = &this->m_qmakespec;
    QLatin1String::QLatin1String((QLatin1String *)&local_e8,"/qmake.conf");
    local_b8.m_string.d.ptr = (char16_t *)local_e8.m_size;
    local_b8.m_string.d.size = (qsizetype)local_e8.m_data;
    local_b8.m_string.d.d = (Data *)pQVar2;
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_68,(QStringBuilder<QString_&,_QLatin1String> *)&local_b8);
    VVar4 = evaluateFile(this,(QString *)&local_68,EvalConfigFile,(LoadFlags)0x0);
    if (VVar4 == ReturnTrue) {
      ProString::ProString(&local_b8,pQVar2);
      ProStringList::ProStringList((ProStringList *)&local_80,&local_b8);
      ProKey::ProKey((ProKey *)&local_e8,"QMAKESPEC");
      this_00 = (QArrayDataPointer<ProString> *)valuesRef(this,(ProKey *)&local_e8);
      QArrayDataPointer<ProString>::operator=(this_00,&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      local_e8 = QMakeInternal::IoUtils::fileName(pQVar2);
      QStringView::toString(&local_b8.m_string,&local_e8);
      pQVar2 = (QString *)(this->m_qmakespecName).d.d;
      pDVar3 = (Data *)(this->m_qmakespecName).d.ptr;
      (this->m_qmakespecName).d.d = local_b8.m_string.d.d;
      (this->m_qmakespecName).d.ptr = local_b8.m_string.d.ptr;
      psVar1 = (storage_type_conflict *)(this->m_qmakespecName).d.size;
      (this->m_qmakespecName).d.size = local_b8.m_string.d.size;
      local_b8.m_string.d.d = (Data *)pQVar2;
      local_b8.m_string.d.ptr = (char16_t *)pDVar3;
      local_b8.m_string.d.size = (qsizetype)psVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      QLatin1String::QLatin1String(&local_f8,"spec_post.prf");
      this_01 = &local_b8;
      QString::QString(&this_01->m_string,local_f8);
      VVar4 = evaluateFeatureFile(this,&this_01->m_string,false);
      bVar6 = VVar4 == ReturnTrue;
    }
    else {
      psVar5 = (storage_type *)
               QByteArrayView::lengthHelperCharArray
                         ("Could not read qmake configuration file %1.",0x2c);
      this_01 = (ProString *)&local_e8;
      QVar7.m_data = psVar5;
      QVar7.m_size = (qsizetype)this_01;
      QString::fromLatin1(QVar7);
      bVar6 = false;
      QString::arg<QString,_true>
                (&local_b8.m_string,(QString *)this_01,(QString *)&local_68,0,(QChar)0x20);
      evalError(this,&local_b8.m_string);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_01);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeEvaluator::loadSpecInternal()
{
    if (evaluateFeatureFile(QLatin1String("spec_pre.prf")) != ReturnTrue)
        return false;
    QString spec = m_qmakespec + QLatin1String("/qmake.conf");
    if (evaluateFile(spec, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue) {
        evalError(fL1S("Could not read qmake configuration file %1.").arg(spec));
        return false;
    }
#ifndef QT_BUILD_QMAKE
    // Legacy support for Qt4 default specs
#  ifdef Q_OS_UNIX
    if (m_qmakespec.endsWith(QLatin1String("/default-host"))
        || m_qmakespec.endsWith(QLatin1String("/default"))) {
        QString rspec = QFileInfo(m_qmakespec).symLinkTarget();
        if (!rspec.isEmpty())
            m_qmakespec = QDir::cleanPath(QDir(m_qmakespec).absoluteFilePath(rspec));
    }
#  else
    // We can't resolve symlinks as they do on Unix, so configure.exe puts
    // the source of the qmake.conf at the end of the default/qmake.conf in
    // the QMAKESPEC_ORIGINAL variable.
    const ProString &orig_spec = first(ProKey("QMAKESPEC_ORIGINAL"));
    if (!orig_spec.isEmpty()) {
        QString spec = orig_spec.toQString();
        if (IoUtils::isAbsolutePath(spec))
            m_qmakespec = spec;
    }
#  endif
#endif
    valuesRef(ProKey("QMAKESPEC")) = ProString(m_qmakespec);
    m_qmakespecName = IoUtils::fileName(m_qmakespec).toString();
    // This also ensures that m_featureRoots is valid.
    if (evaluateFeatureFile(QLatin1String("spec_post.prf")) != ReturnTrue)
        return false;
    return true;
}